

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

AnnotationHeader * lrit::getHeader<lrit::AnnotationHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  HeaderReader<lrit::AnnotationHeader> *in_RDI;
  HeaderReader<lrit::AnnotationHeader> r;
  AnnotationHeader *h;
  Buffer *in_stack_ffffffffffffff78;
  HeaderReader<lrit::AnnotationHeader> *this;
  HeaderReader<lrit::AnnotationHeader> local_50;
  
  this = in_RDI;
  HeaderReader<lrit::AnnotationHeader>::HeaderReader(in_RDI,in_stack_ffffffffffffff78,0);
  HeaderReader<lrit::AnnotationHeader>::getHeader(this);
  HeaderReader<lrit::AnnotationHeader>::read
            (&local_50,(int)this + 8,(void *)(long)(int)(*(ushort *)((long)&this->b_ + 2) - 3),
             in_RCX);
  HeaderReader<lrit::AnnotationHeader>::~HeaderReader
            ((HeaderReader<lrit::AnnotationHeader> *)0x121671);
  return (AnnotationHeader *)in_RDI;
}

Assistant:

AnnotationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<AnnotationHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.text, h.headerLength - 3);
  return h;
}